

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

int ebur128_true_peak(ebur128_state *st,uint channel_number,double *out)

{
  double dVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = 2;
  if (((~st->mode & 0x31U) == 0) && (iVar2 = 3, channel_number < st->channels)) {
    dVar3 = st->d->true_peak[channel_number];
    dVar1 = st->d->sample_peak[channel_number];
    if (dVar3 <= dVar1) {
      dVar3 = dVar1;
    }
    *out = dVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ebur128_true_peak(ebur128_state* st,
                      unsigned int channel_number,
                      double* out) {
  if ((st->mode & EBUR128_MODE_TRUE_PEAK) != EBUR128_MODE_TRUE_PEAK) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  if (channel_number >= st->channels) {
    return EBUR128_ERROR_INVALID_CHANNEL_INDEX;
  }

  *out = EBUR128_MAX(st->d->true_peak[channel_number],
                     st->d->sample_peak[channel_number]);
  return EBUR128_SUCCESS;
}